

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1objs.c
# Opt level: O2

FT_Error T1_Face_Init(FT_Stream stream,FT_Face t1face,FT_Int face_index,FT_Int num_params,
                     FT_Parameter *params)

{
  byte *pbVar1;
  char cVar2;
  char cVar3;
  undefined4 uVar4;
  FT_String *pFVar5;
  FT_Face_Internal pFVar6;
  short sVar7;
  undefined8 memory;
  _func_FT_Error_PS_Parser_T1_Field_void_ptr_ptr_FT_UInt_FT_ULong_ptr *stream_00;
  undefined7 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  bool bVar11;
  ushort uVar12;
  int iVar13;
  FT_Error FVar14;
  FT_Pointer pvVar15;
  FT_String *pFVar16;
  void *pvVar17;
  ulong uVar18;
  char *pcVar19;
  FT_Fixed FVar20;
  int *piVar21;
  FT_Pointer pvVar22;
  void *pvVar23;
  FT_Stream pFVar24;
  long lVar25;
  T1_Loader extraout_RDX;
  T1_Loader extraout_RDX_00;
  T1_Loader extraout_RDX_01;
  T1_Loader extraout_RDX_02;
  T1_Loader extraout_RDX_03;
  T1_Loader extraout_RDX_04;
  T1_Loader extraout_RDX_05;
  T1_Loader extraout_RDX_06;
  T1_Loader extraout_RDX_07;
  T1_Loader extraout_RDX_08;
  T1_Loader extraout_RDX_09;
  T1_Loader extraout_RDX_10;
  T1_Loader extraout_RDX_11;
  T1_Loader extraout_RDX_12;
  T1_Loader extraout_RDX_13;
  T1_Loader extraout_RDX_14;
  T1_Loader extraout_RDX_15;
  T1_Loader extraout_RDX_16;
  T1_Loader extraout_RDX_17;
  FT_Byte *extraout_RDX_18;
  FT_Byte *extraout_RDX_19;
  FT_Byte *pFVar26;
  T1_Loader extraout_RDX_20;
  T1_Loader extraout_RDX_21;
  T1_Loader extraout_RDX_22;
  T1_Loader extraout_RDX_23;
  T1_Loader extraout_RDX_24;
  T1_Loader extraout_RDX_25;
  T1_Loader extraout_RDX_26;
  T1_Loader extraout_RDX_27;
  T1_Loader extraout_RDX_28;
  T1_Loader extraout_RDX_29;
  T1_Loader extraout_RDX_30;
  T1_Loader pTVar27;
  T1_Loader extraout_RDX_31;
  FT_Face root;
  byte bVar28;
  short sVar29;
  FT_Int FVar30;
  uint uVar31;
  char *pcVar32;
  T1_Loader pTVar33;
  T1_Loader pTVar34;
  undefined7 uVar35;
  short sVar36;
  long lVar37;
  T1_Loader pTVar38;
  size_t sVar39;
  _func_FT_Long_PS_Parser *a;
  long lVar40;
  FT_UInt glyph_index;
  undefined8 *puVar41;
  int iVar42;
  ulong uVar43;
  T1_Loader pTVar44;
  T1_Loader pTVar45;
  undefined1 local_c38 [8];
  T1_LoaderRec loader;
  T1_Loader local_58;
  T1_Loader local_50;
  undefined1 local_48 [8];
  FT_Error error;
  FT_Error local_38;
  undefined1 local_34 [8];
  FT_UShort tag;
  
  t1face->num_faces = 1;
  pvVar15 = ft_module_get_service(&t1face->driver->root,"postscript-cmaps",'\x01');
  t1face[3].num_glyphs = (FT_Long)pvVar15;
  pFVar16 = (FT_String *)FT_Get_Module_Interface((t1face->driver->root).library,"psaux");
  t1face[3].family_name = pFVar16;
  if (pFVar16 == (FT_String *)0x0) {
    return 0xb;
  }
  pvVar17 = FT_Get_Module_Interface((t1face->driver->root).library,"pshinter");
  *(void **)&t1face[3].units_per_EM = pvVar17;
  pFVar5 = t1face[3].family_name;
  memset(local_c38,0,0x2c8);
  t1face[3].bbox.yMin = -1;
  *(undefined4 *)&t1face[3].bbox.xMax = 0;
  t1face[1].memory = (FT_Memory)0x100000007;
  *(undefined4 *)((long)&t1face[1].available_sizes + 4) = 4;
  t1face[2].face_index = 0xf5c;
  t1face[1].driver = (FT_Driver)&uleb128_0027a000;
  pTVar33 = (T1_Loader)t1face->memory;
  pFVar24 = t1face->stream;
  pcVar19 = (char *)pTVar33;
  (*(code *)**(undefined8 **)(pFVar5 + 8))(local_c38,0,0);
  loader.parser.stream = (FT_Stream)0x0;
  loader.parser.base_dict = (FT_Byte *)0x0;
  loader.parser.base_len = 0;
  loader.parser.private_dict._0_7_ = 0;
  loader.parser.private_dict._7_1_ = 0;
  loader.parser.private_len._0_1_ = '\0';
  loader.parser.private_len._1_1_ = '\0';
  loader.parser.private_len._2_1_ = 0;
  pcVar32 = "%!PS-AdobeFont";
  loader.parser.root.funcs.load_field_table =
       (_func_FT_Error_PS_Parser_T1_Field_void_ptr_ptr_FT_UInt_FT_ULong_ptr *)pFVar24;
  iVar13 = check_type1_format(pFVar24,"%!PS-AdobeFont",0xe);
  local_48._0_2_ = (undefined2)iVar13;
  local_48._2_2_ = (undefined2)((uint)iVar13 >> 0x10);
  if (iVar13 == 0) {
LAB_002299fd:
    pcVar32 = (char *)0x0;
    iVar13 = FT_Stream_Seek(pFVar24,0);
    local_48._0_2_ = (undefined2)iVar13;
    local_48._2_2_ = (undefined2)((uint)iVar13 >> 0x10);
    pTVar27 = extraout_RDX_01;
    if (iVar13 != 0) goto LAB_00229a29;
    pcVar32 = local_34;
    iVar13 = read_pfb_tag(pFVar24,(FT_UShort *)pcVar32,(FT_ULong *)&local_58);
    local_48._0_2_ = (undefined2)iVar13;
    local_48._2_2_ = (undefined2)((uint)iVar13 >> 0x10);
    pTVar27 = extraout_RDX_02;
    if (iVar13 != 0) goto LAB_00229a29;
    if (local_34._0_2_ == -0x7fff) {
      loader.parser.private_len._0_1_ = '\x01';
    }
    else {
      pcVar32 = (char *)0x0;
      iVar13 = FT_Stream_Seek(pFVar24,0);
      local_48._0_2_ = (undefined2)iVar13;
      local_48._2_2_ = (undefined2)((uint)iVar13 >> 0x10);
      pTVar27 = extraout_RDX_07;
      if (iVar13 != 0) goto LAB_00229a29;
      local_58 = (T1_Loader)pFVar24->size;
    }
    pTVar38 = local_58;
    if (pFVar24->read != (FT_Stream_IoFunc)0x0) {
      pcVar32 = (char *)ft_mem_alloc((FT_Memory)pTVar33,(FT_Long)local_58,(FT_Error *)local_48);
      iVar13 = CONCAT22(local_48._2_2_,local_48._0_2_);
      pTVar27 = extraout_RDX_08;
      loader.parser.stream = (FT_Stream)pcVar32;
      if (iVar13 == 0) {
        iVar13 = FT_Stream_Read(pFVar24,(FT_Byte *)pcVar32,(FT_ULong)pTVar38);
        local_48._0_2_ = (undefined2)iVar13;
        local_48._2_2_ = (undefined2)((uint)iVar13 >> 0x10);
        pTVar27 = extraout_RDX_09;
        if (iVar13 == 0) {
          loader.parser.base_dict = (FT_Byte *)pTVar38;
          goto LAB_00229cc8;
        }
      }
      goto LAB_00229a29;
    }
    loader.parser.stream = (FT_Stream)(pFVar24->base + pFVar24->pos);
    loader.parser.base_dict = (FT_Byte *)local_58;
    loader.parser.private_len._1_1_ = '\x01';
    pcVar32 = (char *)local_58;
    iVar13 = FT_Stream_Skip(pFVar24,(FT_Long)local_58);
    local_48._0_2_ = (undefined2)iVar13;
    local_48._2_2_ = (undefined2)((uint)iVar13 >> 0x10);
    pTVar27 = extraout_RDX_12;
    if (iVar13 != 0) goto LAB_00229a29;
LAB_00229cc8:
    local_c38 = (undefined1  [8])loader.parser.stream;
    loader.parser.root.base = loader.parser.base_dict + (long)&(loader.parser.stream)->base;
    loader.parser.root.cursor = (FT_Byte *)local_c38;
LAB_00229a6f:
    pTVar33 = (T1_Loader)local_c38;
    pcVar19 = (char *)loader.parser.base_dict;
    local_38 = parse_dict((T1_Face)t1face,pTVar33,(FT_Byte *)loader.parser.stream,
                          (FT_ULong)loader.parser.base_dict);
    stream_00 = loader.parser.root.funcs.load_field_table;
    FVar30 = (FT_Int)pTVar33;
    pTVar27 = extraout_RDX_04;
    if (local_38 == 0) {
      local_34._0_4_ = 0;
      if ((char)loader.parser.private_len == '\0') {
        pcVar19 = (char *)(loader.parser.base_dict + (long)loader.parser.stream);
        iVar13 = 3;
        pTVar33 = (T1_Loader)loader.parser.root._24_8_;
        pTVar38 = (T1_Loader)loader.parser.stream;
        do {
          pTVar38 = (T1_Loader)((long)&(pTVar38->parser).root.base + 2);
          while (((((pTVar27 = (T1_Loader)((long)&pTVar38[-1].keywords_encountered + 3),
                    *(char *)((long)&pTVar38[-1].subrs_hash + 6) != 'e' || (pcVar19 <= pTVar27)) ||
                   (*(char *)((long)&pTVar38[-1].subrs_hash + 7) != 'e')) ||
                  ((pTVar38[-1].fontdata != 'x' || (pTVar38[-1].field_0x2c1 != 'e')))) ||
                 (pTVar38[-1].field_0x2c2 != 'c'))) {
            pTVar27 = (T1_Loader)((long)&pTVar38[-1].subrs_hash + 7);
            pTVar38 = (T1_Loader)((long)&(pTVar38->parser).root.cursor + 1);
            if (pcVar19 <= pTVar27) goto LAB_00229d11;
          }
          local_c38 = (undefined1  [8])loader.parser.stream;
          loader.parser.root.base = (FT_Byte *)pTVar38;
          local_50 = pTVar33;
          while ((ulong)local_c38 < pTVar38) {
            if ((((T1_Loader)((long)&(((T1_ParserRec *)local_c38)->root).cursor + 5) < pTVar38 &&
                  *(char *)&(((T1_ParserRec *)local_c38)->root).cursor == 'e') &&
                (*(char *)((long)&(((T1_ParserRec *)local_c38)->root).cursor + 1) == 'e')) &&
               ((*(char *)((long)&(((T1_ParserRec *)local_c38)->root).cursor + 2) == 'x' &&
                ((*(char *)((long)&(((T1_ParserRec *)local_c38)->root).cursor + 3) == 'e' &&
                 (*(char *)((long)&(((T1_ParserRec *)local_c38)->root).cursor + 4) == 'c')))))) {
              loader.parser.root.base =
                   loader.parser.base_dict + (long)&(loader.parser.stream)->base;
              (*loader.parser.root.funcs.skip_spaces)((PS_Parser)local_c38);
              pFVar26 = loader.parser.root.base;
              sVar39 = (long)loader.parser.root.base - (long)local_c38;
              pTVar33 = (T1_Loader)0xa;
              _error = (T1_Loader)local_c38;
              pvVar17 = memchr((void *)local_c38,10,sVar39);
              if (pvVar17 == (void *)0x0) {
                bVar11 = true;
                pcVar19 = (char *)_error;
                pTVar27 = extraout_RDX_27;
                pTVar38 = _error;
              }
              else {
                pTVar33 = (T1_Loader)0xd;
                pvVar23 = memchr(_error,0xd,sVar39);
                bVar11 = pvVar23 < pvVar17;
                pcVar19 = (char *)_error;
                pTVar27 = extraout_RDX_28;
                pTVar38 = _error;
              }
              goto LAB_0022a67f;
            }
            (*loader.parser.root.funcs.skip_spaces)((PS_Parser)local_c38);
            pTVar27 = extraout_RDX_10;
            if ((int)loader.parser.root.limit != 0) break;
            (*loader.parser.root.funcs.done)((PS_Parser)local_c38);
            pTVar27 = extraout_RDX_11;
          }
          pcVar19 = (char *)(loader.parser.base_dict + (long)loader.parser.stream);
          pTVar33 = local_50;
        } while (pTVar38 < pcVar19);
      }
      else {
        local_50 = (T1_Loader)loader.parser.root._24_8_;
        _error = (T1_Loader)FT_Stream_Pos((FT_Stream)loader.parser.root.funcs.load_field_table);
        loader.parser.private_dict._0_7_ = 0;
        loader.parser.private_dict._7_1_ = 0;
        while (pTVar33 = (T1_Loader)local_48,
              iVar13 = read_pfb_tag((FT_Stream)stream_00,(FT_UShort *)local_48,(FT_ULong *)&local_58
                                   ), pTVar27 = extraout_RDX_05, iVar13 == 0) {
          if (local_48._0_2_ != 0x8002) {
            iVar13 = 3;
            if ((CONCAT17(loader.parser.private_dict._7_1_,loader.parser.private_dict._0_7_) != 0)
               && (pTVar33 = _error, iVar13 = FT_Stream_Seek((FT_Stream)stream_00,(FT_ULong)_error),
                  pTVar27 = extraout_RDX_13, local_34._0_4_ = iVar13, iVar13 == 0)) {
              pTVar33 = (T1_Loader)
                        CONCAT17(loader.parser.private_dict._7_1_,loader.parser.private_dict._0_7_);
              loader.parser.base_len =
                   (FT_ULong)ft_mem_alloc((FT_Memory)local_50,(FT_Long)pTVar33,(FT_Error *)local_34)
              ;
              pTVar27 = extraout_RDX_20;
              iVar13 = local_34._0_4_;
              if (local_34._0_4_ == 0) {
                lVar40 = 0;
                goto LAB_0022a235;
              }
            }
            break;
          }
          lVar40 = (long)&(local_58->parser).root.cursor +
                   CONCAT17(loader.parser.private_dict._7_1_,loader.parser.private_dict._0_7_);
          loader.parser.private_dict._0_7_ = (undefined7)lVar40;
          loader.parser.private_dict._7_1_ = (undefined1)((ulong)lVar40 >> 0x38);
          pTVar33 = local_58;
          iVar13 = FT_Stream_Skip((FT_Stream)stream_00,(FT_Long)local_58);
          pTVar27 = extraout_RDX_06;
          local_34._0_4_ = iVar13;
          if (iVar13 != 0) break;
        }
      }
      goto LAB_00229d11;
    }
  }
  else {
    pTVar27 = extraout_RDX;
    if ((char)iVar13 == '\x02') {
      pcVar32 = "%!FontType";
      iVar13 = check_type1_format(pFVar24,"%!FontType",10);
      local_48._0_2_ = (undefined2)iVar13;
      local_48._2_2_ = (undefined2)((uint)iVar13 >> 0x10);
      pTVar27 = extraout_RDX_00;
      if (iVar13 == 0) goto LAB_002299fd;
    }
LAB_00229a29:
    FVar30 = (FT_Int)pcVar32;
    local_38 = iVar13;
    if (loader.parser.private_len._1_1_ == '\0') {
      ft_mem_free((FT_Memory)pTVar33,loader.parser.stream);
      FVar30 = (FT_Int)loader.parser.stream;
      loader.parser.stream = (FT_Stream)0x0;
      pTVar27 = extraout_RDX_03;
      local_38 = CONCAT22(local_48._2_2_,local_48._0_2_);
      if (CONCAT22(local_48._2_2_,local_48._0_2_) == 0) {
        local_38 = 0;
        goto LAB_00229a6f;
      }
    }
  }
  goto LAB_00229d15;
LAB_0022a67f:
  uVar9 = loader.parser.private_dict._7_1_;
  uVar8 = loader.parser.private_dict._0_7_;
  pFVar24 = loader.parser.stream;
  if (pFVar26 <= pTVar38) goto LAB_00229d11;
  bVar28 = *(byte *)&(pTVar38->parser).root.cursor;
  pTVar27 = (T1_Loader)(ulong)bVar28;
  if ((bVar28 != 9) && (bVar28 != 0x20)) {
    uVar35 = (undefined7)((ulong)pTVar33 >> 8);
    pTVar33 = (T1_Loader)CONCAT71(uVar35,bVar28 == 0xd);
    if ((bVar28 != 10) &&
       (bVar28 = bVar28 == 0xd & bVar11, pTVar33 = (T1_Loader)CONCAT71(uVar35,bVar28), bVar28 == 0))
    {
      sVar39 = (long)(loader.parser.base_dict + (long)loader.parser.stream) - (long)pcVar19;
      loader.parser.private_dict._7_1_ = (undefined1)(sVar39 >> 0x38);
      uVar10 = loader.parser.private_dict._7_1_;
      loader.parser.private_dict._0_7_ = (undefined7)sVar39;
      uVar35 = loader.parser.private_dict._0_7_;
      _error = pTVar38;
      if (loader.parser.private_len._1_1_ == '\0') {
        loader.parser.private_len._2_1_ = 1;
        loader.parser.stream = (FT_Stream)0x0;
        loader.parser.base_dict = (FT_Byte *)0x0;
      }
      else {
        pTVar33 = (T1_Loader)(sVar39 + 1);
        loader.parser.private_dict._0_7_ = uVar8;
        loader.parser.private_dict._7_1_ = uVar9;
        pFVar24 = (FT_Stream)ft_mem_alloc((FT_Memory)local_50,(FT_Long)pTVar33,(FT_Error *)local_34)
        ;
        pTVar27 = extraout_RDX_31;
        iVar13 = local_34._0_4_;
        loader.parser.base_len = (FT_ULong)pFVar24;
        if (local_34._0_4_ != 0) goto LAB_00229d11;
      }
      pbVar1 = (byte *)((long)&(_error->parser).root.cursor + 3);
      pcVar19 = (char *)_error;
      loader.parser.base_len = (FT_ULong)pFVar24;
      loader.parser.private_dict._0_7_ = uVar35;
      loader.parser.private_dict._7_1_ = uVar10;
      if (pbVar1 < pFVar26) {
        bVar28 = *(byte *)&(_error->parser).root.cursor;
        pcVar19 = (char *)0x3f0000003f;
        if (((((bVar28 - 0x30 < 10) ||
              ((uVar31 = bVar28 - 0x41, uVar31 < 0x26 &&
               ((0x3f0000003fU >> ((ulong)uVar31 & 0x3f) & 1) != 0)))) &&
             ((bVar28 = *(byte *)((long)&(_error->parser).root.cursor + 1), bVar28 - 0x30 < 10 ||
              ((uVar31 = bVar28 - 0x41, uVar31 < 0x26 &&
               ((0x3f0000003fU >> ((ulong)uVar31 & 0x3f) & 1) != 0)))))) &&
            ((bVar28 = *(byte *)((long)&(_error->parser).root.cursor + 2), bVar28 - 0x30 < 10 ||
             ((uVar31 = bVar28 - 0x41, uVar31 < 0x26 &&
              ((0x3f0000003fU >> ((ulong)uVar31 & 0x3f) & 1) != 0)))))) &&
           ((bVar28 = *pbVar1, bVar28 - 0x30 < 10 ||
            ((uVar31 = bVar28 - 0x41, uVar31 < 0x26 &&
             ((0x3f0000003fU >> ((ulong)uVar31 & 0x3f) & 1) != 0)))))) {
          local_c38 = (undefined1  [8])_error;
          (**(code **)(*(long *)(pFVar5 + 8) + 0x30))(local_c38,pFVar24,sVar39,local_48);
          lVar40 = CONCAT44(local_48._4_4_,CONCAT22(local_48._2_2_,local_48._0_2_));
          loader.parser.private_dict._0_7_ = (undefined7)lVar40;
          loader.parser.private_dict._7_1_ = SUB41(local_48._4_4_,3);
          *(undefined1 *)(loader.parser.base_len + lVar40) = 0;
          pcVar19 = (char *)loader.parser.base_len;
          goto LAB_0022a28f;
        }
      }
      memmove(pFVar24,_error,sVar39);
      goto LAB_0022a28f;
    }
  }
  pcVar19 = (char *)((long)&(((T1_Loader)pcVar19)->parser).root.cursor + 1);
  pTVar38 = (T1_Loader)((long)&(pTVar38->parser).root.cursor + 1);
  goto LAB_0022a67f;
LAB_0022a235:
  loader.parser.private_dict._0_7_ = (undefined7)lVar40;
  loader.parser.private_dict._7_1_ = (undefined1)((ulong)lVar40 >> 0x38);
  local_34._0_4_ = read_pfb_tag((FT_Stream)stream_00,(FT_UShort *)local_48,(FT_ULong *)&local_58);
  pTVar38 = local_58;
  if ((local_34._0_4_ != 0) || (local_48._0_2_ != 0x8002)) goto LAB_0022a28b;
  pTVar33 = (T1_Loader)
            (loader.parser.base_len +
            CONCAT17(loader.parser.private_dict._7_1_,loader.parser.private_dict._0_7_));
  iVar13 = FT_Stream_Read((FT_Stream)stream_00,(FT_Byte *)pTVar33,(FT_ULong)local_58);
  pTVar27 = extraout_RDX_21;
  local_34._0_4_ = iVar13;
  if (iVar13 != 0) goto LAB_00229d11;
  lVar40 = (long)&(pTVar38->parser).root.cursor +
           CONCAT17(loader.parser.private_dict._7_1_,loader.parser.private_dict._0_7_);
  local_34._0_4_ = 0;
  goto LAB_0022a235;
LAB_0022a28b:
  local_34._0_4_ = 0;
LAB_0022a28f:
  pTVar33 = (T1_Loader)CONCAT17(loader.parser.private_dict._7_1_,loader.parser.private_dict._0_7_);
  (**(code **)(pFVar5 + 0x20))(loader.parser.base_len,pTVar33,0xd971);
  FVar30 = (FT_Int)pTVar33;
  if (3 < CONCAT17(loader.parser.private_dict._7_1_,loader.parser.private_dict._0_7_)) {
    *(undefined1 *)loader.parser.base_len = 0x20;
    *(undefined1 *)(loader.parser.base_len + 1) = 0x20;
    *(undefined1 *)(loader.parser.base_len + 2) = 0x20;
    *(undefined1 *)(loader.parser.base_len + 3) = 0x20;
    local_c38 = (undefined1  [8])loader.parser.base_len;
    pcVar19 = (char *)CONCAT17(loader.parser.private_dict._7_1_,loader.parser.private_dict._0_7_);
    loader.parser.root.cursor = (FT_Byte *)loader.parser.base_len;
    loader.parser.root.base =
         (FT_Byte *)((long)&(((T1_Loader)pcVar19)->parser).root.cursor + loader.parser.base_len);
    local_38 = local_34._0_4_;
    pTVar27 = (T1_Loader)loader.parser.base_len;
    if (local_34._0_4_ == 0) {
      pTVar33 = (T1_Loader)local_c38;
      local_38 = parse_dict((T1_Face)t1face,pTVar33,(FT_Byte *)loader.parser.base_len,
                            (FT_ULong)pcVar19);
      FVar30 = (FT_Int)pTVar33;
      pTVar27 = extraout_RDX_23;
      if (local_38 == 0) {
        *(byte *)&t1face[1].num_charmaps = (byte)t1face[1].num_charmaps & 0xfe;
        piVar21 = (int *)t1face[3].bbox.xMin;
        if (piVar21 == (int *)0x0) {
LAB_0022a467:
          *(undefined4 *)&t1face[3].bbox.xMax = 0;
        }
        else {
          uVar31 = piVar21[0xbe];
          pcVar19 = (char *)(ulong)uVar31;
          if ((uVar31 != 0) && (uVar31 != piVar21[1])) {
            piVar21[0xbe] = 0;
          }
          if ((*piVar21 == 0) || (pcVar19 = (char *)(ulong)(uint)piVar21[1], piVar21[1] == 0)) {
            T1_Done_Blend((T1_Face)t1face);
            piVar21 = (int *)t1face[3].bbox.xMin;
            pTVar27 = extraout_RDX_24;
            if (piVar21 == (int *)0x0) goto LAB_0022a467;
            pcVar19 = (char *)(ulong)(uint)piVar21[1];
          }
          pcVar19 = (char *)((long)pcVar19 * 0x18 + 0x18);
          pTVar27 = (T1_Loader)0x0;
          do {
            pTVar33 = (T1_Loader)&(pTVar27->parser).root.error;
            if ((T1_Loader)pcVar19 == pTVar33) goto LAB_0022a3c0;
            pcVar32 = (char *)((long)(piVar21 + 0x2a) + (long)pTVar27);
            pTVar27 = pTVar33;
          } while (*pcVar32 != '\0');
          T1_Done_Blend((T1_Face)t1face);
          pTVar27 = extraout_RDX_25;
          if (t1face[3].bbox.xMin == 0) goto LAB_0022a467;
LAB_0022a3c0:
          pcVar19 = (char *)(ulong)(uint)t1face[3].bbox.xMax;
          if ((T1_Loader)pcVar19 != (T1_Loader)0x0) {
            pTVar33 = (T1_Loader)0x8;
            pvVar22 = ft_mem_realloc(t1face->memory,8,0,(FT_Long)pcVar19,(void *)0x0,&local_38);
            FVar30 = (FT_Int)pTVar33;
            t1face[3].bbox.yMax = (FT_Pos)pvVar22;
            pTVar27 = extraout_RDX_26;
            if (local_38 != 0) {
              *(undefined4 *)&t1face[3].bbox.xMax = 0;
              goto LAB_00229d15;
            }
          }
        }
        FVar30 = (FT_Int)pTVar33;
        t1face[2].max_advance_width = loader.encoding_table.funcs.release._0_2_;
        t1face[2].max_advance_height = loader.encoding_table.funcs.release._2_2_;
        if (loader.subrs.capacity != 0) {
          *(undefined4 *)&t1face[2].bbox.yMin = loader.swap_table.funcs.release._0_4_;
          t1face[2].generic.data = (void *)loader._592_8_;
          t1face[2].bbox.xMax = loader.subrs._32_8_;
          t1face[2].bbox.yMax = (FT_Pos)loader.subrs.elements;
          *(_func_void_PS_Table **)&t1face[2].units_per_EM = loader.subrs.funcs.release;
          loader.subrs.capacity = 0;
          loader.subrs.funcs.release = (_func_void_PS_Table *)0x0;
        }
        if ((t1face->internal->incremental_interface == (FT_Incremental_InterfaceRec *)0x0) &&
           (loader.charstrings.capacity == 0)) {
          local_38 = 3;
        }
        loader.charstrings.capacity = 0;
        t1face[2].generic.finalizer = (FT_Generic_Finalizer)loader.glyph_names.funcs.release;
        t1face[2].size = (FT_Size)loader.charstrings._32_8_;
        t1face[2].charmap = (FT_CharMap)loader.charstrings.elements;
        t1face[2].bbox.xMin = loader._296_8_;
        t1face[2].glyph = (FT_GlyphSlot_conflict)loader.glyph_names._32_8_;
        loader.num_glyphs = 0;
        loader._300_4_ = 0;
        loader.glyph_names.max_elems = 0;
        loader.glyph_names.num_elems = 0;
        if (*(int *)&t1face[2].style_name == 1) {
          pTVar44 = (T1_Loader)0x0;
          pTVar38 = (T1_Loader)(ulong)(uint)loader.encoding_table.funcs.release;
          if ((int)(uint)loader.encoding_table.funcs.release < 1) {
            pTVar38 = pTVar44;
          }
          _error = (T1_Loader)(ulong)(uint)loader.encoding_table.init;
          if ((int)(uint)loader.encoding_table.init < 1) {
            _error = pTVar44;
          }
          local_50 = (T1_Loader)((ulong)local_50 & 0xffffffff00000000);
          uVar31 = 0;
          for (; FVar30 = (FT_Int)pTVar33, pTVar44 != _error;
              pTVar44 = (T1_Loader)((long)&(pTVar44->parser).root.cursor + 1)) {
            *(undefined2 *)(*(long *)&t1face[2].num_charmaps + (long)pTVar44 * 2) = 0;
            pcVar19 = ".notdef";
            t1face[2].charmaps[(long)pTVar44] = (FT_CharMap)".notdef";
            pcVar32 = *(char **)(loader.encoding_table._32_8_ + (long)pTVar44 * 8);
            if (pcVar32 != (char *)0x0) {
              for (pTVar45 = (T1_Loader)0x0; pTVar38 != pTVar45;
                  pTVar45 = (T1_Loader)((long)&(pTVar45->parser).root.cursor + 1)) {
                pTVar33 = (T1_Loader)(&(t1face[2].glyph)->library)[(long)pTVar45];
                pTVar34 = pTVar33;
                iVar13 = strcmp(pcVar32,(char *)pTVar33);
                if (iVar13 == 0) {
                  *(short *)(*(long *)&t1face[2].num_charmaps + (long)pTVar44 * 2) = (short)pTVar45;
                  t1face[2].charmaps[(long)pTVar44] = (FT_CharMap)pTVar33;
                  pcVar19 = (char *)pTVar44;
                  iVar13 = strcmp(".notdef",(char *)pTVar33);
                  pTVar27 = extraout_RDX_30;
                  if (iVar13 != 0) {
                    iVar42 = (int)pTVar44;
                    iVar13 = (int)local_50;
                    if (iVar42 < (int)local_50) {
                      iVar13 = iVar42;
                    }
                    local_50 = (T1_Loader)CONCAT44(local_50._4_4_,iVar13);
                    pcVar19 = (char *)(ulong)(iVar42 + 1U);
                    if ((long)(int)uVar31 <= (long)pTVar44) {
                      uVar31 = iVar42 + 1U;
                    }
                    pTVar27 = (T1_Loader)(ulong)uVar31;
                  }
                  break;
                }
                pTVar27 = extraout_RDX_29;
                pTVar33 = pTVar34;
              }
            }
          }
          *(int *)&t1face[2].field_0x3c = (int)local_50;
          *(uint *)&t1face[2].available_sizes = uVar31;
          t1face[2].num_fixed_sizes = loader.parser._184_4_;
        }
      }
    }
    goto LAB_00229d15;
  }
  pTVar27 = extraout_RDX_22;
  iVar13 = 3;
LAB_00229d11:
  FVar30 = (FT_Int)pTVar33;
  local_38 = iVar13;
LAB_00229d15:
  memory = loader.parser.root._24_8_;
  if (loader.encoding_table.funcs.add != (_func_FT_Error_PS_Table_FT_Int_void_ptr_FT_UInt *)0x0) {
    (*loader.encoding_table.funcs.add)((PS_Table)&loader.num_chars,FVar30,pTVar27,(FT_UInt)pcVar19);
    pTVar27 = extraout_RDX_14;
  }
  if (loader.charstrings.funcs.add != (_func_FT_Error_PS_Table_FT_Int_void_ptr_FT_UInt *)0x0) {
    (*loader.charstrings.funcs.add)
              ((PS_Table)&loader.glyph_names.funcs.release,FVar30,pTVar27,(FT_UInt)pcVar19);
    pTVar27 = extraout_RDX_15;
  }
  if (loader.glyph_names.funcs.add != (_func_FT_Error_PS_Table_FT_Int_void_ptr_FT_UInt *)0x0) {
    (*loader.glyph_names.funcs.add)((PS_Table)&loader.num_glyphs,FVar30,pTVar27,(FT_UInt)pcVar19);
    pTVar27 = extraout_RDX_16;
  }
  if (loader.swap_table.funcs.add != (_func_FT_Error_PS_Table_FT_Int_void_ptr_FT_UInt *)0x0) {
    (*loader.swap_table.funcs.add)
              ((PS_Table)&loader.charstrings.funcs.release,FVar30,pTVar27,(FT_UInt)pcVar19);
    pTVar27 = extraout_RDX_17;
  }
  if (loader.subrs.funcs.add != (_func_FT_Error_PS_Table_FT_Int_void_ptr_FT_UInt *)0x0) {
    (*loader.subrs.funcs.add)((PS_Table)&loader.num_subrs,FVar30,pTVar27,(FT_UInt)pcVar19);
  }
  ft_hash_str_free((FT_Hash)loader.subrs.funcs.release,(FT_Memory)memory);
  ft_mem_free((FT_Memory)memory,loader.subrs.funcs.release);
  loader.subrs.funcs.release = (_func_void_PS_Table *)0x0;
  pFVar24 = (FT_Stream)loader.parser.base_len;
  ft_mem_free((FT_Memory)loader.parser.root._24_8_,(void *)loader.parser.base_len);
  loader.parser.base_len = 0;
  pFVar26 = extraout_RDX_18;
  if (loader.parser.private_len._1_1_ == '\0') {
    pFVar24 = loader.parser.stream;
    ft_mem_free((FT_Memory)loader.parser.root._24_8_,loader.parser.stream);
    loader.parser.stream = (FT_Stream)0x0;
    pFVar26 = extraout_RDX_19;
  }
  (*loader.parser.root.funcs.init)
            ((PS_Parser)local_c38,(FT_Byte *)pFVar24,pFVar26,(FT_Memory)pcVar19);
  if (face_index < 0 || local_38 != 0) {
    return local_38;
  }
  if ((short)face_index != 0) {
    return 6;
  }
  iVar13._0_2_ = t1face[2].max_advance_width;
  iVar13._2_2_ = t1face[2].max_advance_height;
  t1face->num_glyphs = (long)iVar13;
  t1face->face_index = 0;
  uVar43 = t1face->face_flags;
  uVar18 = uVar43 | 0xa11;
  t1face->face_flags = uVar18;
  if (*(char *)&t1face[1].style_name != '\0') {
    uVar18 = uVar43 | 0xa15;
    t1face->face_flags = uVar18;
  }
  lVar40 = t1face[3].bbox.xMin;
  if (lVar40 != 0) {
    t1face->face_flags = uVar18 | 0x100;
  }
  pcVar32 = (char *)t1face[1].style_flags;
  t1face->family_name = pcVar32;
  t1face->style_name = (FT_String *)0x0;
  if (pcVar32 == (char *)0x0) {
    if (t1face[2].family_name != (FT_String *)0x0) {
      t1face->family_name = t1face[2].family_name;
    }
  }
  else {
    pcVar19 = (char *)t1face[1].face_flags;
    if (pcVar19 != (char *)0x0) {
      do {
        cVar2 = *pcVar19;
        while( true ) {
          if (cVar2 == '\0') {
            pcVar19 = "Regular";
            goto LAB_00229ef7;
          }
          cVar3 = *pcVar32;
          if (cVar2 == cVar3) break;
          if ((cVar2 == ' ') || (cVar2 == '-')) goto LAB_00229ec2;
          if ((cVar3 != ' ') && (cVar3 != '-')) {
            if (cVar3 != '\0') goto LAB_00229ee2;
            goto LAB_00229ef7;
          }
          pcVar32 = pcVar32 + 1;
        }
        pcVar32 = pcVar32 + 1;
LAB_00229ec2:
        pcVar19 = pcVar19 + 1;
      } while( true );
    }
  }
LAB_00229ee2:
  pcVar19 = "Regular";
  if ((char *)t1face[1].num_glyphs != (char *)0x0) {
    pcVar19 = (char *)t1face[1].num_glyphs;
  }
LAB_00229ef7:
  t1face->style_name = pcVar19;
  uVar43 = (ulong)(t1face[1].family_name != (FT_String *)0x0);
  t1face->style_flags = uVar43;
  pcVar32 = (char *)t1face[1].num_glyphs;
  if ((pcVar32 != (char *)0x0) &&
     ((iVar13 = strcmp(pcVar32,"Bold"), iVar13 == 0 ||
      (iVar13 = strcmp(pcVar32,"Black"), iVar13 == 0)))) {
    t1face->style_flags = uVar43 | 2;
  }
  t1face->num_fixed_sizes = 0;
  t1face->available_sizes = (FT_Bitmap_Size *)0x0;
  (t1face->bbox).xMin = (long)t1face[2].extensions >> 0x10;
  pFVar6 = t1face[2].internal;
  (t1face->bbox).yMin = (long)pFVar6 >> 0x10;
  lVar25 = t1face[3].num_faces + 0xffff;
  (t1face->bbox).xMax = lVar25 >> 0x10;
  lVar37 = t1face[3].face_index + 0xffff;
  (t1face->bbox).yMax = lVar37 >> 0x10;
  uVar12 = t1face->units_per_EM;
  if (uVar12 == 0) {
    t1face->units_per_EM = 1000;
    uVar12 = 1000;
  }
  sVar36 = (short)((ulong)lVar37 >> 0x10);
  t1face->ascender = sVar36;
  sVar29 = (short)((ulong)pFVar6 >> 0x10);
  t1face->descender = sVar29;
  glyph_index = 0;
  sVar7 = (short)((ulong)((uint)uVar12 * 0xc) / 10);
  iVar13 = (int)sVar36 - (int)sVar29;
  sVar29 = (short)iVar13;
  if (iVar13 <= sVar7) {
    sVar29 = sVar7;
  }
  t1face->height = sVar29;
  t1face->max_advance_width = (FT_Short)((ulong)lVar25 >> 0x10);
  pFVar5 = t1face[3].family_name;
  iVar13 = (*(code *)**(undefined8 **)(pFVar5 + 0x18))
                     (local_c38,t1face,0,0,t1face[2].glyph,lVar40,0,0,T1_Parse_Glyph);
  if (iVar13 == 0) {
    loader.parser.root.funcs.to_token_array._6_1_ = 1;
    loader.parser.root.funcs.to_token_array._4_1_ = 0;
    a = (_func_FT_Long_PS_Parser *)0x0;
    for (; iVar42._0_2_ = t1face[2].max_advance_width, iVar42._2_2_ = t1face[2].max_advance_height,
        (int)glyph_index < iVar42; glyph_index = glyph_index + 1) {
      T1_Parse_Glyph((T1_Decoder_conflict)local_c38,glyph_index);
      if ((long)a < (long)loader.parser.root.funcs.to_int) {
        a = loader.parser.root.funcs.to_int;
      }
      if (glyph_index == 0) {
        a = loader.parser.root.funcs.to_int;
      }
    }
    (**(code **)(*(long *)(pFVar5 + 0x18) + 8))(local_c38);
    FVar20 = FT_RoundFix((FT_Fixed)a);
    t1face->max_advance_width = (FT_Short)((ulong)FVar20 >> 0x10);
  }
  t1face->max_advance_height = t1face->height;
  uVar4 = *(undefined4 *)((long)&t1face[1].style_name + 2);
  t1face->underline_position = (short)uVar4;
  t1face->underline_thickness = (short)((uint)uVar4 >> 0x10);
  if (pvVar15 == (FT_Pointer)0x0) {
switchD_0022a177_default:
    FVar14 = 0;
  }
  else {
    puVar41 = *(undefined8 **)(pFVar16 + 0x40);
    loader.parser.root.cursor = (FT_Byte *)0x10003756e6963;
    local_c38 = (undefined1  [8])t1face;
    FVar14 = FT_CMap_New((FT_CMap_Class)puVar41[3],(FT_Pointer)0x0,(FT_CharMap)local_c38,
                         (FT_CMap_conflict *)0x0);
    if (FVar14 != 0 && (char)FVar14 != -0x5d) {
      return FVar14;
    }
    switch(*(undefined4 *)&t1face[2].style_name) {
    case 1:
      loader.parser.root.cursor = (FT_Byte *)0x2000741444243;
      puVar41 = puVar41 + 2;
      break;
    case 2:
      loader.parser.root.cursor = (FT_Byte *)0x741444f42;
      break;
    case 3:
      puVar41 = puVar41 + 3;
      loader.parser.root.cursor = (FT_Byte *)0x300076c617431;
      break;
    case 4:
      loader.parser.root.cursor = (FT_Byte *)0x1000741444245;
      puVar41 = puVar41 + 1;
      break;
    default:
      goto switchD_0022a177_default;
    }
    FVar14 = 0;
    if ((FT_CMap_Class)*puVar41 != (FT_CMap_Class)0x0) {
      FVar14 = FT_CMap_New((FT_CMap_Class)*puVar41,(FT_Pointer)0x0,(FT_CharMap)local_c38,
                           (FT_CMap_conflict *)0x0);
    }
  }
  return FVar14;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T1_Face_Init( FT_Stream      stream,
                FT_Face        t1face,          /* T1_Face */
                FT_Int         face_index,
                FT_Int         num_params,
                FT_Parameter*  params )
  {
    T1_Face             face = (T1_Face)t1face;
    FT_Error            error;
    FT_Service_PsCMaps  psnames;
    PSAux_Service       psaux;
    T1_Font             type1 = &face->type1;
    PS_FontInfo         info = &type1->font_info;

    FT_UNUSED( num_params );
    FT_UNUSED( params );
    FT_UNUSED( stream );


    face->root.num_faces = 1;

    FT_FACE_FIND_GLOBAL_SERVICE( face, psnames, POSTSCRIPT_CMAPS );
    face->psnames = psnames;

    face->psaux = FT_Get_Module_Interface( FT_FACE_LIBRARY( face ),
                                           "psaux" );
    psaux = (PSAux_Service)face->psaux;
    if ( !psaux )
    {
      FT_ERROR(( "T1_Face_Init: cannot access `psaux' module\n" ));
      error = FT_THROW( Missing_Module );
      goto Exit;
    }

    face->pshinter = FT_Get_Module_Interface( FT_FACE_LIBRARY( face ),
                                              "pshinter" );

    FT_TRACE2(( "Type 1 driver\n" ));

    /* open the tokenizer; this will also check the font format */
    error = T1_Open_Face( face );
    if ( error )
      goto Exit;

    /* if we just wanted to check the format, leave successfully now */
    if ( face_index < 0 )
      goto Exit;

    /* check the face index */
    if ( ( face_index & 0xFFFF ) > 0 )
    {
      FT_ERROR(( "T1_Face_Init: invalid face index\n" ));
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* now load the font program into the face object */

    /* initialize the face object fields */

    /* set up root face fields */
    {
      FT_Face  root = (FT_Face)&face->root;


      root->num_glyphs = type1->num_glyphs;
      root->face_index = 0;

      root->face_flags |= FT_FACE_FLAG_SCALABLE    |
                          FT_FACE_FLAG_HORIZONTAL  |
                          FT_FACE_FLAG_GLYPH_NAMES |
                          FT_FACE_FLAG_HINTER;

      if ( info->is_fixed_pitch )
        root->face_flags |= FT_FACE_FLAG_FIXED_WIDTH;

      if ( face->blend )
        root->face_flags |= FT_FACE_FLAG_MULTIPLE_MASTERS;

      /* The following code to extract the family and the style is very   */
      /* simplistic and might get some things wrong.  For a full-featured */
      /* algorithm you might have a look at the whitepaper given at       */
      /*                                                                  */
      /*   https://blogs.msdn.com/text/archive/2007/04/23/wpf-font-selection-model.aspx */

      /* get style name -- be careful, some broken fonts only */
      /* have a `/FontName' dictionary entry!                 */
      root->family_name = info->family_name;
      root->style_name  = NULL;

      if ( root->family_name )
      {
        char*  full   = info->full_name;
        char*  family = root->family_name;


        if ( full )
        {
          FT_Bool  the_same = TRUE;


          while ( *full )
          {
            if ( *full == *family )
            {
              family++;
              full++;
            }
            else
            {
              if ( *full == ' ' || *full == '-' )
                full++;
              else if ( *family == ' ' || *family == '-' )
                family++;
              else
              {
                the_same = FALSE;

                if ( !*family )
                  root->style_name = full;
                break;
              }
            }
          }

          if ( the_same )
            root->style_name = (char *)"Regular";
        }
      }
      else
      {
        /* do we have a `/FontName'? */
        if ( type1->font_name )
          root->family_name = type1->font_name;
      }

      if ( !root->style_name )
      {
        if ( info->weight )
          root->style_name = info->weight;
        else
          /* assume `Regular' style because we don't know better */
          root->style_name = (char *)"Regular";
      }

      /* compute style flags */
      root->style_flags = 0;
      if ( info->italic_angle )
        root->style_flags |= FT_STYLE_FLAG_ITALIC;
      if ( info->weight )
      {
        if ( !ft_strcmp( info->weight, "Bold"  ) ||
             !ft_strcmp( info->weight, "Black" ) )
          root->style_flags |= FT_STYLE_FLAG_BOLD;
      }

      /* no embedded bitmap support */
      root->num_fixed_sizes = 0;
      root->available_sizes = NULL;

      root->bbox.xMin =   type1->font_bbox.xMin            >> 16;
      root->bbox.yMin =   type1->font_bbox.yMin            >> 16;
      /* no `U' suffix here to 0xFFFF! */
      root->bbox.xMax = ( type1->font_bbox.xMax + 0xFFFF ) >> 16;
      root->bbox.yMax = ( type1->font_bbox.yMax + 0xFFFF ) >> 16;

      /* Set units_per_EM if we didn't set it in t1_parse_font_matrix. */
      if ( !root->units_per_EM )
        root->units_per_EM = 1000;

      root->ascender  = (FT_Short)( root->bbox.yMax );
      root->descender = (FT_Short)( root->bbox.yMin );

      root->height = (FT_Short)( ( root->units_per_EM * 12 ) / 10 );
      if ( root->height < root->ascender - root->descender )
        root->height = (FT_Short)( root->ascender - root->descender );

      /* now compute the maximum advance width */
      root->max_advance_width =
        (FT_Short)( root->bbox.xMax );
      {
        FT_Pos  max_advance;


        error = T1_Compute_Max_Advance( face, &max_advance );

        /* in case of error, keep the standard width */
        if ( !error )
          root->max_advance_width = (FT_Short)FIXED_TO_INT( max_advance );
        else
          error = FT_Err_Ok;   /* clear error */
      }

      root->max_advance_height = root->height;

      root->underline_position  = (FT_Short)info->underline_position;
      root->underline_thickness = (FT_Short)info->underline_thickness;
    }

    {
      FT_Face  root = &face->root;


      if ( psnames )
      {
        FT_CharMapRec    charmap;
        T1_CMap_Classes  cmap_classes = psaux->t1_cmap_classes;
        FT_CMap_Class    clazz;


        charmap.face = root;

        /* first of all, try to synthesize a Unicode charmap */
        charmap.platform_id = TT_PLATFORM_MICROSOFT;
        charmap.encoding_id = TT_MS_ID_UNICODE_CS;
        charmap.encoding    = FT_ENCODING_UNICODE;

        error = FT_CMap_New( cmap_classes->unicode, NULL, &charmap, NULL );
        if ( error                                      &&
             FT_ERR_NEQ( error, No_Unicode_Glyph_Name ) )
          goto Exit;
        error = FT_Err_Ok;

        /* now, generate an Adobe Standard encoding when appropriate */
        charmap.platform_id = TT_PLATFORM_ADOBE;
        clazz               = NULL;

        switch ( type1->encoding_type )
        {
        case T1_ENCODING_TYPE_STANDARD:
          charmap.encoding    = FT_ENCODING_ADOBE_STANDARD;
          charmap.encoding_id = TT_ADOBE_ID_STANDARD;
          clazz               = cmap_classes->standard;
          break;

        case T1_ENCODING_TYPE_EXPERT:
          charmap.encoding    = FT_ENCODING_ADOBE_EXPERT;
          charmap.encoding_id = TT_ADOBE_ID_EXPERT;
          clazz               = cmap_classes->expert;
          break;

        case T1_ENCODING_TYPE_ARRAY:
          charmap.encoding    = FT_ENCODING_ADOBE_CUSTOM;
          charmap.encoding_id = TT_ADOBE_ID_CUSTOM;
          clazz               = cmap_classes->custom;
          break;

        case T1_ENCODING_TYPE_ISOLATIN1:
          charmap.encoding    = FT_ENCODING_ADOBE_LATIN_1;
          charmap.encoding_id = TT_ADOBE_ID_LATIN_1;
          clazz               = cmap_classes->unicode;
          break;

        default:
          ;
        }

        if ( clazz )
          error = FT_CMap_New( clazz, NULL, &charmap, NULL );
      }
    }

  Exit:
    return error;
  }